

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_operation.cc
# Opt level: O2

bool __thiscall
sptk::ScalarOperation::AddMagicNumberReplacer(ScalarOperation *this,double replacement_number)

{
  bool bVar1;
  ModuleInterface *local_20;
  
  bVar1 = this->use_magic_number_;
  if (bVar1 == true) {
    local_20 = (ModuleInterface *)operator_new(0x10);
    local_20->_vptr_ModuleInterface = (_func_int **)&PTR__ModuleInterface_00116cb0;
    local_20[1]._vptr_ModuleInterface = (_func_int **)replacement_number;
    std::
    vector<sptk::ScalarOperation::ModuleInterface*,std::allocator<sptk::ScalarOperation::ModuleInterface*>>
    ::emplace_back<sptk::ScalarOperation::ModuleInterface*>
              ((vector<sptk::ScalarOperation::ModuleInterface*,std::allocator<sptk::ScalarOperation::ModuleInterface*>>
                *)&this->modules_,&local_20);
    this->use_magic_number_ = false;
  }
  return bVar1;
}

Assistant:

bool ScalarOperation::AddMagicNumberReplacer(double replacement_number) {
  if (!use_magic_number_) return false;
  modules_.push_back(new MagicNumberReplacer(replacement_number));
  use_magic_number_ = false;
  return true;
}